

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O1

int64_t gnu_sparse_10_atol(archive_read *a,tar *tar,int64_t *remaining,int64_t *unconsumed)

{
  char cVar1;
  archive_string *paVar2;
  long lVar3;
  char *pcVar4;
  void *pvVar5;
  archive_string *paVar6;
  size_t sVar7;
  long lVar8;
  int error_number;
  long lVar9;
  size_t s;
  char *unaff_R14;
  size_t local_50;
  archive_read *local_48;
  char *local_40;
  archive_string *local_38;
  
  local_38 = &tar->line;
  local_48 = a;
  do {
    lVar9 = *remaining;
    if (99 < lVar9) {
      lVar9 = 100;
    }
    if (*unconsumed != 0) {
      __archive_read_consume(a,*unconsumed);
      *unconsumed = 0;
    }
    pcVar4 = (char *)__archive_read_ahead(a,1,(ssize_t *)&local_50);
    s = local_50;
    if (pcVar4 == (char *)0x0 || (long)local_50 < 1) {
      sVar7 = 0xffffffffffffffe2;
      a = local_48;
    }
    else {
      pvVar5 = memchr(pcVar4,10,local_50);
      a = local_48;
      if (pvVar5 == (void *)0x0) {
        *unconsumed = s;
        local_40 = unaff_R14;
        if ((long)s <= lVar9) {
          pvVar5 = (void *)0x0;
          sVar7 = 0;
          do {
            paVar2 = local_38;
            paVar6 = archive_string_ensure(local_38,s);
            if (paVar6 == (archive_string *)0x0) {
              error_number = 0xc;
              pcVar4 = "Can\'t allocate working buffer";
              goto LAB_00135025;
            }
            memcpy(paVar2->s + sVar7,pcVar4,local_50);
            a = local_48;
            if (*unconsumed != 0) {
              __archive_read_consume(local_48,*unconsumed);
              *unconsumed = 0;
            }
            sVar7 = sVar7 + local_50;
            if (pvVar5 != (void *)0x0) {
              unaff_R14 = local_38->s;
              goto LAB_00135054;
            }
            pcVar4 = (char *)__archive_read_ahead(a,1,(ssize_t *)&local_50);
            if (((long)local_50 < 1) || (pcVar4 == (char *)0x0)) goto LAB_0013502c;
            pvVar5 = memchr(pcVar4,10,local_50);
            if (pvVar5 != (void *)0x0) {
              local_50 = (long)pvVar5 + (1 - (long)pcVar4);
            }
            *unconsumed = local_50;
            s = local_50 + sVar7;
          } while ((long)s <= lVar9);
        }
        error_number = 0x54;
        pcVar4 = "Line too long";
LAB_00135025:
        a = local_48;
        archive_set_error(&local_48->archive,error_number,pcVar4);
LAB_0013502c:
        sVar7 = 0xffffffffffffffe2;
        unaff_R14 = local_40;
      }
      else {
        sVar7 = (long)pvVar5 + (1 - (long)pcVar4);
        local_50 = sVar7;
        if (lVar9 < (long)sVar7) {
          archive_set_error(&local_48->archive,0x54,"Line too long");
          sVar7 = 0xffffffffffffffe2;
        }
        else {
          *unconsumed = sVar7;
          unaff_R14 = pcVar4;
        }
      }
    }
LAB_00135054:
    if ((long)sVar7 < 1) {
      return -0x1e;
    }
    *remaining = *remaining - sVar7;
    if (*unaff_R14 != '#') {
      lVar8 = sVar7 + 1;
      lVar9 = 0;
      while( true ) {
        cVar1 = *unaff_R14;
        if (cVar1 == '\n') {
          return lVar9;
        }
        if ((byte)(cVar1 - 0x3aU) < 0xf6) break;
        lVar3 = 0x7fffffffffffffff;
        if (lVar9 < 0xccccccccccccccd) {
          lVar3 = 0x7fffffffffffffff;
          if (lVar9 != 0xccccccccccccccc || (byte)(cVar1 - 0x30U) < 8) {
            lVar3 = (ulong)(byte)(cVar1 - 0x30U) + lVar9 * 10;
          }
        }
        lVar9 = lVar3;
        unaff_R14 = unaff_R14 + 1;
        lVar8 = lVar8 + -1;
        if (lVar8 < 2) {
          return -0x14;
        }
      }
      return -0x14;
    }
  } while( true );
}

Assistant:

static int64_t
gnu_sparse_10_atol(struct archive_read *a, struct tar *tar,
    int64_t *remaining, int64_t *unconsumed)
{
	int64_t l, limit, last_digit_limit;
	const char *p;
	ssize_t bytes_read;
	int base, digit;

	base = 10;
	limit = INT64_MAX / base;
	last_digit_limit = INT64_MAX % base;

	/*
	 * Skip any lines starting with '#'; GNU tar specs
	 * don't require this, but they should.
	 */
	do {
		bytes_read = readline(a, tar, &p,
			(ssize_t)tar_min(*remaining, 100), unconsumed);
		if (bytes_read <= 0)
			return (ARCHIVE_FATAL);
		*remaining -= bytes_read;
	} while (p[0] == '#');

	l = 0;
	while (bytes_read > 0) {
		if (*p == '\n')
			return (l);
		if (*p < '0' || *p >= '0' + base)
			return (ARCHIVE_WARN);
		digit = *p - '0';
		if (l > limit || (l == limit && digit > last_digit_limit))
			l = INT64_MAX; /* Truncate on overflow. */
		else
			l = (l * base) + digit;
		p++;
		bytes_read--;
	}
	/* TODO: Error message. */
	return (ARCHIVE_WARN);
}